

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu383_com.c
# Opt level: O0

RK_S32 update_size_offset(Vdpu384aRcbInfo *info,RK_U32 reg_idx,RK_S32 offset,RK_S32 len,RK_S32 idx)

{
  uint uVar1;
  RK_S32 buf_size;
  RK_S32 idx_local;
  RK_S32 len_local;
  RK_S32 offset_local;
  RK_U32 reg_idx_local;
  Vdpu384aRcbInfo *info_local;
  
  uVar1 = len * rcb_coeff[idx] + 0x3f & 0xffffffc0;
  info[idx].reg_idx = reg_idx;
  info[idx].offset = offset;
  info[idx].size = uVar1;
  return uVar1;
}

Assistant:

static RK_S32 update_size_offset(Vdpu383RcbInfo *info, RK_U32 reg_idx,
                                 RK_S32 offset, RK_S32 len, RK_S32 idx)
{
    RK_S32 buf_size = 0;

    buf_size = 2 * MPP_ALIGN(len * rcb_coeff[idx], RCB_ALLINE_SIZE);
    info[idx].reg_idx = reg_idx;
    info[idx].offset = offset;
    info[idx].size = buf_size;

    return buf_size;
}